

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O0

QVariant * __thiscall QtIcoHandler::option(QtIcoHandler *this,ImageOption option)

{
  long lVar1;
  bool bVar2;
  T TVar3;
  int in_EDX;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  ICONDIRENTRY iconEntry;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  QSize *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_EDX == 0) || (in_EDX == 0xe)) &&
     (bVar2 = ICOReader::readIconEntry
                        ((ICOReader *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa4,
                         (ICONDIRENTRY *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)), bVar2)) {
    if (in_EDX == 0) {
      QSize::QSize((QSize *)0xaa000000aa,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      QVariant::QVariant(in_RDI,local_20);
      goto LAB_00107bdb;
    }
    if (in_EDX == 0xe) {
      TVar3 = QSpecialInteger::operator_cast_to_unsigned_short
                        ((QSpecialInteger<QLittleEndianStorageType<unsigned_short>_> *)0x107b62);
      if (TVar3 == 2) {
        QVariant::QVariant(in_RDI,1);
      }
      else if (TVar3 == 0x18) {
        QVariant::QVariant(in_RDI,4);
      }
      else if (TVar3 == 0x20) {
        QVariant::QVariant(in_RDI,5);
      }
      else {
        QVariant::QVariant(in_RDI,3);
      }
      goto LAB_00107bdb;
    }
  }
  QVariant::QVariant((QVariant *)0x107bdb);
LAB_00107bdb:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QtIcoHandler::option(ImageOption option) const
{
    if (option == Size || option == ImageFormat) {
        ICONDIRENTRY iconEntry;
        if (m_pICOReader->readIconEntry(m_currentIconIndex, &iconEntry)) {
            switch (option) {
                case Size:
                    return QSize(iconEntry.bWidth ? iconEntry.bWidth : 256,
                                iconEntry.bHeight ? iconEntry.bHeight : 256);

                case ImageFormat:
                    switch (iconEntry.wBitCount) {
                        case 2:
                            return QImage::Format_Mono;
                        case 24:
                            return QImage::Format_RGB32;
                        case 32:
                            return QImage::Format_ARGB32;
                        default:
                            return QImage::Format_Indexed8;
                    }
                    break;
                default:
                    break;
            }
        }
    }
    return QVariant();
}